

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

la_base85_decode_result la_base85_decode(char *str,char *end)

{
  ulong uVar1;
  char *func;
  char *in_RSI;
  long lVar2;
  char *in_RDI;
  bool bVar3;
  la_base85_decode_result lVar4;
  char *unaff_retaddr;
  int i;
  anon_union_4_2_f9eceaa0 v;
  size_t outpos;
  size_t inpos;
  char *ptr;
  uint8_t *out;
  size_t outsize;
  int local_50;
  undefined4 local_4c;
  long local_48;
  char *local_38;
  char *size;
  char *in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffffc;
  
  uVar1 = (((long)in_RSI - (long)in_RDI) / 5 + 4) * 4;
  local_38 = in_RDI;
  func = (char *)la_xcalloc(outpos,_i,unaff_retaddr,in_stack_fffffffffffffffc,
                            in_stack_fffffffffffffff0);
  local_48 = 0;
  size = local_38;
  while( true ) {
    bVar3 = true;
    if ((long)in_RSI - (long)local_38 < 5) {
      bVar3 = *local_38 == 'z';
    }
    if (!bVar3) break;
    local_4c = 0;
    if (*local_38 == 'z') {
      local_38 = local_38 + 1;
    }
    else {
      for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
        local_4c = (*local_38 + -0x21) * la_base85_decode::base85[local_50] + local_4c;
        local_38 = local_38 + 1;
      }
    }
    if (uVar1 <= local_48 + 5U) {
      uVar1 = (uVar1 + 5 >> 2) + uVar1 + 5;
      func = (char *)la_xrealloc(in_stack_fffffffffffffff0,(size_t)size,in_RSI,(int)(uVar1 >> 0x20),
                                 func);
    }
    func[local_48] = local_4c._3_1_;
    func[local_48 + 1] = local_4c._2_1_;
    lVar2 = local_48 + 3;
    func[local_48 + 2] = local_4c._1_1_;
    local_48 = local_48 + 4;
    func[lVar2] = (char)local_4c;
  }
  lVar4.len = (undefined4)local_48;
  lVar4.buf = (uint8_t *)func;
  lVar4._12_4_ = 0;
  return lVar4;
}

Assistant:

static la_base85_decode_result la_base85_decode(char const *str, char const *end) {
	static uint32_t const base85[] = {
		85 * 85 * 85 * 85,
		85 * 85 * 85,
		85 * 85,
		85,
		1
	};
	la_assert(str != NULL);
	la_assert(str < end);

	// A rough approximation of the output buffer size needed.
	// Five base85 digits encode a single 32-bit word
	// Allow four extra words for potential 'z' occurrences
	// (all-zero word encoded with a single character)
	size_t outsize = ((end - str) / 5 + 4) * 4;
	la_debug_print(D_INFO, "approx outsize: %zu\n", outsize);
	uint8_t *out = LA_XCALLOC(outsize, sizeof(uint8_t));

	char const *ptr = str;
	size_t inpos = 0, outpos = 0;
	union {
		uint32_t val;
		struct {
#ifdef IS_BIG_ENDIAN
			uint8_t b3,b2,b1,b0;
#else
			uint8_t b0,b1,b2,b3;
#endif
		} b;
	} v;

	while(end - ptr >= 5 || *ptr == 'z') {
		v.val = 0;
		if(*ptr == 'z') {
			ptr++;
			inpos++;
		} else {
			for(int i = 0; i < 5; i++, inpos++, ptr++) {
				// shall we reject 'z' inside the 5-digit group?
				v.val += (*ptr - 0x21) * base85[i];
			}
		}
		if(LA_UNLIKELY(outpos + 5 >= outsize)) {
			// grow the buffer by 25 percent, but not less than 5 elements
			outsize += 5;
			outsize += outsize / 4;
			la_debug_print(D_INFO, "outbuf too small; resizing to %zu elements\n", outsize);
			out = LA_XREALLOC(out, outsize * sizeof(uint8_t));
		}
		out[outpos++] = v.b.b3;
		out[outpos++] = v.b.b2;
		out[outpos++] = v.b.b1;
		out[outpos++] = v.b.b0;
	}
	if(ptr != end) {
		la_debug_print(D_ERROR, "Input truncated, %td bytes left\n", end - ptr);
	}
	return (la_base85_decode_result){
		.buf = out,
		.len = outpos
	};
}